

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int isNull(iso9660 *iso9660,uchar *h,uint offset,uint bytes)

{
  int iVar1;
  uint uVar2;
  size_t __n;
  
  __n = (size_t)bytes;
  while( true ) {
    if ((uint)__n < 0x800) {
      if ((uint)__n == 0) {
        uVar2 = 1;
      }
      else {
        iVar1 = bcmp(iso9660->null,h + offset,__n);
        uVar2 = (uint)(iVar1 == 0);
      }
      return uVar2;
    }
    iVar1 = bcmp(iso9660->null,h + offset,0x800);
    if (iVar1 == 0) break;
    offset = offset + 0x800;
    __n = __n - 0x800;
  }
  return 0;
}

Assistant:

static int
isNull(struct iso9660 *iso9660, const unsigned char *h, unsigned offset,
unsigned bytes)
{

	while (bytes >= sizeof(iso9660->null)) {
		if (!memcmp(iso9660->null, h + offset, sizeof(iso9660->null)))
			return (0);
		offset += sizeof(iso9660->null);
		bytes -= sizeof(iso9660->null);
	}
	if (bytes)
		return memcmp(iso9660->null, h + offset, bytes) == 0;
	else
		return (1);
}